

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyTinySVD_4x4<float>(Matrix44<float> *A)

{
  float *pfVar1;
  float *pfVar2;
  int i;
  long lVar3;
  Matrix44 *pMVar4;
  float (*pafVar5) [4];
  float (*pafVar6) [4];
  int j;
  long lVar7;
  int iVar8;
  int j_1;
  float fVar9;
  float fVar10;
  float local_144;
  Vec4<float> S;
  Matrix44<float> U;
  Matrix44<float> S_times_Vt;
  Matrix44<float> V;
  Matrix44<float> product;
  
  fVar10 = 0.0;
  pafVar5 = (float (*) [4])A;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      fVar9 = ABS((*(float (*) [4])*pafVar5)[lVar7]);
      if (fVar9 <= fVar10) {
        fVar9 = fVar10;
      }
      fVar10 = fVar9;
    }
    pafVar5 = pafVar5 + 1;
  }
  local_144 = fVar10 * 100.0 * 1.1920929e-07;
  iVar8 = 0;
  while( true ) {
    if (iVar8 == 2) {
      return;
    }
    U.x[0][0] = 1.0;
    U.x[0][1] = 0.0;
    U.x[0][2] = 0.0;
    U.x[0][3] = 0.0;
    U.x[1][0] = 0.0;
    U.x[1][1] = 1.0;
    U.x[1][2] = 0.0;
    U.x[1][3] = 0.0;
    U.x[2][0] = 0.0;
    U.x[2][1] = 0.0;
    U.x[2][2] = 1.0;
    U.x[2][3] = 0.0;
    U.x[3][0] = 0.0;
    U.x[3][1] = 0.0;
    U.x[3][2] = 0.0;
    U.x[3][3] = 1.0;
    V.x[0][0] = 1.0;
    V.x[0][1] = 0.0;
    V.x[0][2] = 0.0;
    V.x[0][3] = 0.0;
    V.x[1][0] = 0.0;
    V.x[1][1] = 1.0;
    V.x[1][2] = 0.0;
    V.x[1][3] = 0.0;
    V.x[2][0] = 0.0;
    V.x[2][1] = 0.0;
    V.x[2][2] = 1.0;
    V.x[2][3] = 0.0;
    V.x[3][0] = 0.0;
    V.x[3][1] = 0.0;
    V.x[3][2] = 0.0;
    V.x[3][3] = 1.0;
    Imath_3_2::jacobiSVD<float>
              ((Matrix44 *)A,(Matrix44 *)&U,(Vec4 *)&S,(Matrix44 *)&V,1.1920929e-07,iVar8 == 0);
    S_times_Vt.x[0][0] = 1.0;
    S_times_Vt.x[0][1] = 0.0;
    S_times_Vt.x[0][2] = 0.0;
    S_times_Vt.x[0][3] = 0.0;
    S_times_Vt.x[1][0] = 0.0;
    S_times_Vt.x[1][1] = 1.0;
    S_times_Vt.x[1][2] = 0.0;
    S_times_Vt.x[1][3] = 0.0;
    S_times_Vt.x[2][0] = 0.0;
    S_times_Vt.x[2][1] = 0.0;
    S_times_Vt.x[2][2] = 1.0;
    S_times_Vt.x[2][3] = 0.0;
    S_times_Vt.x[3][0] = 0.0;
    S_times_Vt.x[3][1] = 0.0;
    S_times_Vt.x[3][2] = 0.0;
    S_times_Vt.x[3][3] = 1.0;
    pafVar5 = (float (*) [4])&S_times_Vt;
    pMVar4 = (Matrix44 *)&V;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        (*(float (*) [4])*pafVar5)[lVar7] =
             *(float *)((long)(U.x + -1) + lVar7 * 4) * *(float *)(pMVar4 + lVar7 * 4);
      }
      pafVar5 = pafVar5 + 1;
      pMVar4 = pMVar4 + 0x10;
    }
    Imath_3_2::Matrix44<float>::transpose(&S_times_Vt);
    pafVar5 = (float (*) [4])&product;
    Imath_3_2::Matrix44<float>::multiply(&U,&S_times_Vt);
    pafVar6 = (float (*) [4])A;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      lVar7 = 0;
      while (lVar7 != 4) {
        pfVar2 = *(float (*) [4])*pafVar5 + lVar7;
        pfVar1 = *(float (*) [4])*pafVar6 + lVar7;
        lVar7 = lVar7 + 1;
        if (local_144 < ABS(*pfVar2 - *pfVar1)) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
        }
      }
      pafVar6 = pafVar6 + 1;
      pafVar5 = pafVar5 + 1;
    }
    if (iVar8 == 0) {
      fVar10 = Imath_3_2::Matrix44<float>::determinant(&U);
      if (fVar10 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
      fVar10 = Imath_3_2::Matrix44<float>::determinant(&V);
      if (fVar10 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    lVar3 = 1;
    while (lVar3 != 4) {
      pfVar1 = &local_144 + lVar3;
      lVar7 = lVar3 * 4;
      lVar3 = lVar3 + 1;
      if (*pfVar1 < *(float *)((long)(U.x + -1) + lVar7)) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    lVar3 = 0;
    while (lVar3 != 3) {
      lVar7 = lVar3 * 4;
      lVar3 = lVar3 + 1;
      if (*(float *)((long)(U.x + -1) + lVar7) < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
      }
    }
    if ((iVar8 != 0) && (S.w < 0.0)) break;
    verifyOrthonormal<float>(&U);
    verifyOrthonormal<float>(&V);
    iVar8 = iVar8 + 1;
  }
  __assert_fail("S[3] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = float]");
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}